

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

char * logging_get_names(void)

{
  Node *pNVar1;
  Node *pNVar2;
  list<file_data> *plVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  iterator i;
  Node *pNVar7;
  char *__dest;
  char *pcVar8;
  
  plVar3 = file_data_list;
  pcVar5 = jh_log_names_buffer;
  if (jh_log_names_buffer == (char *)0x0) {
    pNVar1 = file_data_list->mTail;
    uVar6 = 1;
    pNVar7 = file_data_list->mHead->next;
    for (pNVar2 = pNVar7; pNVar2 != pNVar1; pNVar2 = pNVar2->next) {
      sVar4 = strlen((pNVar2->val).filename);
      uVar6 = uVar6 + (int)sVar4 + 1;
    }
    if (uVar6 == 1) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)malloc((ulong)uVar6);
      pcVar8 = pcVar5;
      __dest = pcVar5;
      jh_log_names_buffer = pcVar5;
      if (pNVar7 != plVar3->mTail) {
        do {
          strcpy(__dest,(pNVar7->val).filename);
          sVar4 = strlen((pNVar7->val).filename);
          pcVar8 = __dest + sVar4 + 1;
          __dest[sVar4] = ' ';
          pNVar7 = pNVar7->next;
          __dest = pcVar8;
        } while (pNVar7 != plVar3->mTail);
      }
      pcVar8[-1] = '\0';
    }
  }
  return pcVar5;
}

Assistant:

const char* logging_get_names()
{
	uint32_t size = 1;
	char* temp;

	TRACE_BEGIN(LOG_LVL_INFO);
	
	if ( jh_log_names_buffer != NULL )
		return jh_log_names_buffer;
	
	// else figure out size, make buffer and copy data into it.

	LOG( "calculating storage size" );
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		size += strlen(i->filename) + 1;
	}

	// if no file in list yet.
	if (size == 1) 
		return NULL;

	jh_log_names_buffer = (char*)LOGGING_MALLOC( size );	
	temp = jh_log_names_buffer;

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		strcpy( temp, i->filename );
		temp += strlen( i->filename );
		*temp = ' ';
		temp++;
	}

	temp--;
	*temp = '\0';

	return jh_log_names_buffer;
}